

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LWOMaterial.cpp
# Opt level: O0

bool __thiscall
Assimp::LWOImporter::HandleTextures
          (LWOImporter *this,aiMaterial *pcMat,TextureList *in,aiTextureType type)

{
  bool bVar1;
  Logger *pLVar2;
  reference pCVar3;
  long lVar4;
  float local_4f4;
  int local_4f0;
  int mapping_;
  undefined1 local_4e0 [8];
  string ss;
  iterator iStack_4b8;
  int flags;
  iterator clip;
  iterator candidate;
  iterator end;
  aiUVTransform trafo;
  float local_484;
  aiVector3t<float> local_480;
  aiVector3t<float> local_474;
  undefined1 local_468 [8];
  aiVector3D v;
  aiTextureMapping mapping;
  Texture *texture;
  const_iterator __end1;
  const_iterator __begin1;
  TextureList *__range1;
  undefined1 local_430 [7];
  bool ret;
  aiString s;
  uint temp;
  uint cur;
  aiTextureType type_local;
  TextureList *in_local;
  aiMaterial *pcMat_local;
  LWOImporter *this_local;
  
  if (pcMat == (aiMaterial *)0x0) {
    __assert_fail("__null != pcMat",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/LWO/LWOMaterial.cpp"
                  ,0x59,
                  "bool Assimp::LWOImporter::HandleTextures(aiMaterial *, const TextureList &, aiTextureType)"
                 );
  }
  s.data[0x3fc] = '\0';
  s.data[0x3fd] = '\0';
  s.data[0x3fe] = '\0';
  s.data[0x3ff] = '\0';
  s.data[0x3f8] = '\0';
  s.data[0x3f9] = '\0';
  s.data[0x3fa] = '\0';
  s.data[0x3fb] = '\0';
  aiString::aiString((aiString *)local_430);
  __range1._7_1_ = false;
  __end1 = std::__cxx11::list<Assimp::LWO::Texture,_std::allocator<Assimp::LWO::Texture>_>::begin
                     (in);
  texture = (Texture *)
            std::__cxx11::list<Assimp::LWO::Texture,_std::allocator<Assimp::LWO::Texture>_>::end(in)
  ;
  do {
    bVar1 = std::operator!=(&__end1,(_Self *)&texture);
    if (!bVar1) {
      return __range1._7_1_;
    }
    register0x00000000 = std::_List_const_iterator<Assimp::LWO::Texture>::operator*(&__end1);
    if (((register0x00000000->enabled & 1U) != 0) && ((register0x00000000->bCanUse & 1U) != 0)) {
      __range1._7_1_ = true;
      switch(register0x00000000->mapMode) {
      case Planar:
        v.y = 5.60519e-45;
        break;
      case Cylindrical:
        v.y = 2.8026e-45;
        break;
      case Spherical:
        v.y = 1.4013e-45;
        break;
      case Cubic:
        v.y = 4.2039e-45;
        break;
      case FrontProjection:
        pLVar2 = DefaultLogger::get();
        Logger::error(pLVar2,"LWO2: Unsupported texture mapping: FrontProjection");
        v.y = 7.00649e-45;
        break;
      case UV:
        if (register0x00000000->mRealUVIndex == 0xffffffff) goto LAB_006749a7;
        s.data._1016_4_ = register0x00000000->mRealUVIndex;
        aiMaterial::AddProperty<int>
                  (pcMat,(int *)(s.data + 0x3f8),1,"$tex.uvwsrc",type,s.data._1020_4_);
        v.y = 0.0;
        break;
      default:
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/LWO/LWOMaterial.cpp"
                      ,0x8a,
                      "bool Assimp::LWOImporter::HandleTextures(aiMaterial *, const TextureList &, aiTextureType)"
                     );
      }
      if (v.y != 0.0) {
        aiVector3t<float>::aiVector3t((aiVector3t<float> *)local_468);
        if (stack0xfffffffffffffba8->majorAxis == AXIS_X) {
          aiVector3t<float>::aiVector3t(&local_474,1.0,0.0,0.0);
          local_468._0_4_ = local_474.x;
          local_468._4_4_ = local_474.y;
          v.x = local_474.z;
        }
        else if (stack0xfffffffffffffba8->majorAxis == AXIS_Y) {
          aiVector3t<float>::aiVector3t(&local_480,0.0,1.0,0.0);
          local_468._0_4_ = local_480.x;
          local_468._4_4_ = local_480.y;
          v.x = local_480.z;
        }
        else {
          aiVector3t<float>::aiVector3t((aiVector3t<float> *)&trafo.mScaling.y,0.0,0.0,1.0);
          local_468._0_4_ = trafo.mScaling.y;
          local_468._4_4_ = trafo.mRotation;
          v.x = local_484;
        }
        aiMaterial::AddProperty(pcMat,(aiVector3D *)local_468,1,"$tex.mapaxis",type,s.data._1020_4_)
        ;
        if ((v.y == 2.8026e-45) || (v.y == 1.4013e-45)) {
          aiUVTransform::aiUVTransform((aiUVTransform *)&end);
          trafo.mTranslation.x = stack0xfffffffffffffba8->wrapAmountW;
          trafo.mTranslation.y = stack0xfffffffffffffba8->wrapAmountH;
          aiMaterial::AddProperty(pcMat,(aiUVTransform *)&end,1,"$tex.uvtrafo",type,s.data._1020_4_)
          ;
        }
        pLVar2 = DefaultLogger::get();
        Logger::debug(pLVar2,"LWO2: Setting up non-UV mapping");
      }
      if ((this->mIsLWO2 & 1U) == 0) {
        std::__cxx11::string::string((string *)local_4e0,(string *)stack0xfffffffffffffba8);
        lVar4 = std::__cxx11::string::length();
        if (lVar4 == 0) {
          pLVar2 = DefaultLogger::get();
          Logger::warn(pLVar2,"LWOB: Empty file name");
          local_4f0 = 3;
        }
        else {
          AdjustTexturePath(this,(string *)local_4e0);
          aiString::Set((aiString *)local_430,(string *)local_4e0);
          local_4f0 = 0;
        }
        std::__cxx11::string::~string((string *)local_4e0);
        if (local_4f0 != 0) goto LAB_006749a7;
      }
      else {
        clip = std::vector<Assimp::LWO::Clip,_std::allocator<Assimp::LWO::Clip>_>::end
                         (&this->mClips);
        s.data._1016_4_ = stack0xfffffffffffffba8->mClipIdx;
        candidate._M_current = clip._M_current;
        iStack_4b8 = std::vector<Assimp::LWO::Clip,_std::allocator<Assimp::LWO::Clip>_>::begin
                               (&this->mClips);
        while (bVar1 = __gnu_cxx::operator!=(&stack0xfffffffffffffb48,&candidate), bVar1) {
          pCVar3 = __gnu_cxx::
                   __normal_iterator<Assimp::LWO::Clip_*,_std::vector<Assimp::LWO::Clip,_std::allocator<Assimp::LWO::Clip>_>_>
                   ::operator*(&stack0xfffffffffffffb48);
          if (pCVar3->idx == s.data._1016_4_) {
            clip._M_current = iStack_4b8._M_current;
          }
          __gnu_cxx::
          __normal_iterator<Assimp::LWO::Clip_*,_std::vector<Assimp::LWO::Clip,_std::allocator<Assimp::LWO::Clip>_>_>
          ::operator++(&stack0xfffffffffffffb48);
        }
        bVar1 = __gnu_cxx::operator==(&clip,&candidate);
        if (bVar1) {
          pLVar2 = DefaultLogger::get();
          Logger::error(pLVar2,"LWO2: Clip index is out of bounds");
          s.data[0x3f8] = '\0';
          s.data[0x3f9] = '\0';
          s.data[0x3fa] = '\0';
          s.data[0x3fb] = '\0';
          aiString::Set((aiString *)local_430,"$texture.png");
        }
        else {
          pCVar3 = __gnu_cxx::
                   __normal_iterator<Assimp::LWO::Clip_*,_std::vector<Assimp::LWO::Clip,_std::allocator<Assimp::LWO::Clip>_>_>
                   ::operator*(&clip);
          if (pCVar3->type == UNSUPPORTED) {
            pLVar2 = DefaultLogger::get();
            Logger::error(pLVar2,"LWO2: Clip type is not supported");
            goto LAB_006749a7;
          }
          pCVar3 = __gnu_cxx::
                   __normal_iterator<Assimp::LWO::Clip_*,_std::vector<Assimp::LWO::Clip,_std::allocator<Assimp::LWO::Clip>_>_>
                   ::operator*(&clip);
          AdjustTexturePath(this,&pCVar3->path);
          pCVar3 = __gnu_cxx::
                   __normal_iterator<Assimp::LWO::Clip_*,_std::vector<Assimp::LWO::Clip,_std::allocator<Assimp::LWO::Clip>_>_>
                   ::operator*(&clip);
          aiString::Set((aiString *)local_430,&pCVar3->path);
          ss.field_2._12_4_ = 0;
          pCVar3 = __gnu_cxx::
                   __normal_iterator<Assimp::LWO::Clip_*,_std::vector<Assimp::LWO::Clip,_std::allocator<Assimp::LWO::Clip>_>_>
                   ::operator*(&clip);
          if ((pCVar3->negate & 1U) != 0) {
            ss.field_2._12_4_ = ss.field_2._12_4_ | 1;
          }
          aiMaterial::AddProperty
                    (pcMat,(int *)(ss.field_2._M_local_buf + 0xc),1,"$tex.flags",type,
                     s.data._1020_4_);
        }
      }
      aiMaterial::AddProperty(pcMat,(aiString *)local_430,"$tex.file",type,s.data._1020_4_);
      aiMaterial::AddProperty<float>
                (pcMat,&stack0xfffffffffffffba8->mStrength,1,"$tex.blend",type,s.data._1020_4_);
      switch(stack0xfffffffffffffba8->blendType) {
      case Normal:
      case Multiply:
        s.data[0x3f8] = '\0';
        s.data[0x3f9] = '\0';
        s.data[0x3fa] = '\0';
        s.data[0x3fb] = '\0';
        break;
      case Subtractive:
      case Difference:
        s.data[0x3f8] = '\x02';
        s.data[0x3f9] = '\0';
        s.data[0x3fa] = '\0';
        s.data[0x3fb] = '\0';
        break;
      case Divide:
        s.data[0x3f8] = '\x03';
        s.data[0x3f9] = '\0';
        s.data[0x3fa] = '\0';
        s.data[0x3fb] = '\0';
        break;
      default:
        s.data[0x3f8] = '\0';
        s.data[0x3f9] = '\0';
        s.data[0x3fa] = '\0';
        s.data[0x3fb] = '\0';
        pLVar2 = DefaultLogger::get();
        Logger::warn(pLVar2,"LWO2: Unsupported texture blend mode: alpha or displacement");
        break;
      case Additive:
        s.data[0x3f8] = '\x01';
        s.data[0x3f9] = '\0';
        s.data[0x3fa] = '\0';
        s.data[0x3fb] = '\0';
      }
      aiMaterial::AddProperty<int>(pcMat,(int *)(s.data + 0x3f8),1,"$tex.op",type,s.data._1020_4_);
      local_4f4 = v.y;
      aiMaterial::AddProperty<int>(pcMat,(int *)&local_4f4,1,"$tex.mapping",type,s.data._1020_4_);
      s.data._1016_4_ = GetMapMode(stack0xfffffffffffffba8->wrapModeWidth);
      aiMaterial::AddProperty<int>
                (pcMat,(int *)(s.data + 0x3f8),1,"$tex.mapmodeu",type,s.data._1020_4_);
      s.data._1016_4_ = GetMapMode(stack0xfffffffffffffba8->wrapModeHeight);
      aiMaterial::AddProperty<int>
                (pcMat,(int *)(s.data + 0x3f8),1,"$tex.mapmodev",type,s.data._1020_4_);
      s.data._1020_4_ = s.data._1020_4_ + 1;
    }
LAB_006749a7:
    std::_List_const_iterator<Assimp::LWO::Texture>::operator++(&__end1);
  } while( true );
}

Assistant:

bool LWOImporter::HandleTextures(aiMaterial* pcMat, const TextureList& in, aiTextureType type)
{
    ai_assert(NULL != pcMat);

    unsigned int cur = 0, temp = 0;
    aiString s;
    bool ret = false;

    for (const auto &texture : in)    {
        if (!texture.enabled || !texture.bCanUse)
            continue;
        ret = true;

        // Convert lightwave's mapping modes to ours. We let them
        // as they are, the GenUVcoords step will compute UV
        // channels if they're not there.

        aiTextureMapping mapping;
        switch (texture.mapMode)
        {
            case LWO::Texture::Planar:
                mapping = aiTextureMapping_PLANE;
                break;
            case LWO::Texture::Cylindrical:
                mapping = aiTextureMapping_CYLINDER;
                break;
            case LWO::Texture::Spherical:
                mapping = aiTextureMapping_SPHERE;
                break;
            case LWO::Texture::Cubic:
                mapping = aiTextureMapping_BOX;
                break;
            case LWO::Texture::FrontProjection:
                ASSIMP_LOG_ERROR("LWO2: Unsupported texture mapping: FrontProjection");
                mapping = aiTextureMapping_OTHER;
                break;
            case LWO::Texture::UV:
                {
                    if( UINT_MAX == texture.mRealUVIndex ) {
                        // We have no UV index for this texture, so we can't display it
                        continue;
                    }

                    // add the UV source index
                    temp = texture.mRealUVIndex;
                    pcMat->AddProperty<int>((int*)&temp,1,AI_MATKEY_UVWSRC(type,cur));

                    mapping = aiTextureMapping_UV;
                }
                break;
            default:
                ai_assert(false);
        };

        if (mapping != aiTextureMapping_UV) {
            // Setup the main axis
            aiVector3D v;
            switch (texture.majorAxis) {
                case Texture::AXIS_X:
                    v = aiVector3D(1.0,0.0,0.0);
                    break;
                case Texture::AXIS_Y:
                    v = aiVector3D(0.0,1.0,0.0);
                    break;
                default: // case Texture::AXIS_Z:
                    v = aiVector3D(0.0,0.0,1.0);
                    break;
            }

            pcMat->AddProperty(&v,1,AI_MATKEY_TEXMAP_AXIS(type,cur));

            // Setup UV scalings for cylindric and spherical projections
            if (mapping == aiTextureMapping_CYLINDER || mapping == aiTextureMapping_SPHERE) {
                aiUVTransform trafo;
                trafo.mScaling.x = texture.wrapAmountW;
                trafo.mScaling.y = texture.wrapAmountH;

                static_assert(sizeof(aiUVTransform)/sizeof(ai_real) == 5, "sizeof(aiUVTransform)/sizeof(ai_real) == 5");
                pcMat->AddProperty(&trafo,1,AI_MATKEY_UVTRANSFORM(type,cur));
            }
            ASSIMP_LOG_DEBUG("LWO2: Setting up non-UV mapping");
        }

        // The older LWOB format does not use indirect references to clips.
        // The file name of a texture is directly specified in the tex chunk.
        if (mIsLWO2)    {
            // find the corresponding clip (take the last one if multiple
            // share the same index)
            ClipList::iterator end = mClips.end(), candidate = end;
            temp = texture.mClipIdx;
            for (ClipList::iterator clip = mClips.begin(); clip != end; ++clip) {
                if ((*clip).idx == temp) {
                    candidate = clip;
                }

            }
            if (candidate == end)   {
                ASSIMP_LOG_ERROR("LWO2: Clip index is out of bounds");
                temp = 0;

                // fixme: apparently some LWO files shipping with Doom3 don't
                // have clips at all ... check whether that's true or whether
                // it's a bug in the loader.

                s.Set("$texture.png");

                //continue;
            }
            else {
                if (Clip::UNSUPPORTED == (*candidate).type) {
                    ASSIMP_LOG_ERROR("LWO2: Clip type is not supported");
                    continue;
                }
                AdjustTexturePath((*candidate).path);
                s.Set((*candidate).path);

                // Additional image settings
                int flags = 0;
                if ((*candidate).negate) {
                    flags |= aiTextureFlags_Invert;
                }
                pcMat->AddProperty(&flags,1,AI_MATKEY_TEXFLAGS(type,cur));
            }
        }
        else
        {
            std::string ss = texture.mFileName;
            if (!ss.length()) {
                ASSIMP_LOG_WARN("LWOB: Empty file name");
                continue;
            }
            AdjustTexturePath(ss);
            s.Set(ss);
        }
        pcMat->AddProperty(&s,AI_MATKEY_TEXTURE(type,cur));

        // add the blend factor
        pcMat->AddProperty<float>(&texture.mStrength,1,AI_MATKEY_TEXBLEND(type,cur));

        // add the blend operation
        switch (texture.blendType)
        {
            case LWO::Texture::Normal:
            case LWO::Texture::Multiply:
                temp = (unsigned int)aiTextureOp_Multiply;
                break;

            case LWO::Texture::Subtractive:
            case LWO::Texture::Difference:
                temp = (unsigned int)aiTextureOp_Subtract;
                break;

            case LWO::Texture::Divide:
                temp = (unsigned int)aiTextureOp_Divide;
                break;

            case LWO::Texture::Additive:
                temp = (unsigned int)aiTextureOp_Add;
                break;

            default:
                temp = (unsigned int)aiTextureOp_Multiply;
                ASSIMP_LOG_WARN("LWO2: Unsupported texture blend mode: alpha or displacement");

        }
        // Setup texture operation
        pcMat->AddProperty<int>((int*)&temp,1,AI_MATKEY_TEXOP(type,cur));

        // setup the mapping mode
        int mapping_ = static_cast<int>(mapping);
        pcMat->AddProperty<int>(&mapping_, 1, AI_MATKEY_MAPPING(type, cur));

        // add the u-wrapping
        temp = (unsigned int)GetMapMode(texture.wrapModeWidth);
        pcMat->AddProperty<int>((int*)&temp,1,AI_MATKEY_MAPPINGMODE_U(type,cur));

        // add the v-wrapping
        temp = (unsigned int)GetMapMode(texture.wrapModeHeight);
        pcMat->AddProperty<int>((int*)&temp,1,AI_MATKEY_MAPPINGMODE_V(type,cur));

        ++cur;
    }
    return ret;
}